

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O3

void duckdb::ColumnArrowToDuckDBDictionary
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               uint64_t parent_offset)

{
  LogicalType *other;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var4;
  ArrowArray *pAVar5;
  void *pvVar6;
  unsigned_long *puVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  ArrowType *this_00;
  bool bVar8;
  VectorBuffer *pVVar9;
  _Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false> _Var10;
  unsigned_long uVar11;
  __uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_> this_01;
  type pVVar12;
  ArrowType *this_02;
  idx_t iVar13;
  long lVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  Vector *other_00;
  data_ptr_t indices_p;
  idx_t i;
  ulong uVar16;
  idx_t entry_idx;
  Vector *this_03;
  bool add_null;
  LogicalType offset_type;
  SelectionVector sel;
  uint64_t in_stack_ffffffffffffff10;
  _Head_base<0UL,_duckdb::Vector_*,_false> local_d0;
  ValidityMask local_c8;
  Vector *local_a0;
  LogicalType local_98;
  ArrowScanLocalState *local_80;
  SelectionVector local_78;
  element_type *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  int64_t local_48;
  ArrowType *local_40;
  idx_t local_38;
  
  peVar1 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (vector->buffer).internal.
           super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_a0 = vector;
  local_48 = nested_offset;
  local_40 = arrow_type;
  if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (peVar1 == (element_type *)0x0) goto LAB_01163238;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)peVar1;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    if (peVar1 == (element_type *)0x0) goto LAB_01163238;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)
             (local_a0->buffer).internal.
             super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)
         (local_a0->buffer).internal.
         super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((element_type *)
        local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((element_type *)
                 local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->type =
             *(int *)&((element_type *)
                      local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->type + 1;
        UNLOCK();
      }
      else {
        *(int *)&((element_type *)
                 local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->type =
             *(int *)&((element_type *)
                      local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->type + 1;
      }
    }
  }
  pVVar9 = shared_ptr<duckdb::VectorBuffer,_true>::operator->
                     ((shared_ptr<duckdb::VectorBuffer,_true> *)&local_c8);
  _Var10._M_head_impl = (VectorAuxiliaryData *)operator_new(0x20);
  peVar3 = (array_state->owned_data).internal.
           super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (array_state->owned_data).internal.
           super___shared_ptr<duckdb::ArrowArrayWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  (_Var10._M_head_impl)->type = ARROW_AUXILIARY;
  (_Var10._M_head_impl)->_vptr_VectorAuxiliaryData = (_func_int **)&PTR__ArrowAuxiliaryData_0243e470
  ;
  _Var10._M_head_impl[1]._vptr_VectorAuxiliaryData = (_func_int **)peVar3;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(_Var10._M_head_impl + 1) + 8) = p_Var2;
  _Var4._M_head_impl =
       (pVVar9->aux_data).
       super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
       .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl;
  (pVVar9->aux_data).
  super_unique_ptr<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>.
  _M_t.
  super___uniq_ptr_impl<duckdb::VectorAuxiliaryData,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::VectorAuxiliaryData_*,_std::default_delete<duckdb::VectorAuxiliaryData>_>
  .super__Head_base<0UL,_duckdb::VectorAuxiliaryData_*,_false>._M_head_impl = _Var10._M_head_impl;
  if (_Var4._M_head_impl != (VectorAuxiliaryData *)0x0) {
    (**(code **)((long)(_Var4._M_head_impl)->_vptr_VectorAuxiliaryData + 8))();
  }
  if ((element_type *)
      local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
  }
LAB_01163238:
  this_00 = local_40;
  add_null = true;
  if (array->null_count < 1) {
    if (parent_mask == (ValidityMask *)0x0) {
      add_null = false;
    }
    else {
      add_null = (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
                 (unsigned_long *)0x0;
    }
  }
  local_80 = array_state->state;
  bVar8 = ArrowArrayScanState::CacheOutdated(array_state,array->dictionary);
  if (bVar8) {
    other = &local_a0->type;
    uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert(array->dictionary->length);
    this_01._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (tuple<duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>)operator_new(0x68);
    LogicalType::LogicalType((LogicalType *)&local_c8,other);
    Vector::Vector((Vector *)
                   this_01._M_t.
                   super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
                   super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl,
                   (LogicalType *)&local_c8,uVar11);
    local_98._0_8_ =
         this_01._M_t.super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>
         .super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    LogicalType::~LogicalType((LogicalType *)&local_c8);
    pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                        ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                         &local_98);
    pAVar5 = array->dictionary;
    uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
    FlatVector::VerifyFlatVector(pVVar12);
    GetValidityMask(&pVVar12->validity,pAVar5,(ArrowScanLocalState *)local_80->chunk_offset,uVar11,0
                    ,0,add_null);
    this_02 = ArrowType::GetDictionary(this_00);
    bVar8 = ArrowType::HasDictionary(this_02);
    if (bVar8) {
      pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                          ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)
                           &local_98);
      pAVar5 = array->dictionary;
      uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
      ColumnArrowToDuckDBDictionary
                (pVVar12,pAVar5,array_state,uVar11,this_02,-1,(ValidityMask *)0x0,0);
    }
    else {
      bVar8 = ArrowType::RunEndEncoded(this_02);
      if (bVar8) {
        pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                              *)&local_98);
        pAVar5 = array->dictionary;
        uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
        ColumnArrowToDuckDBRunEndEncoded
                  (pVVar12,pAVar5,array_state,uVar11,this_02,-1,(ValidityMask *)0x0,
                   in_stack_ffffffffffffff10);
      }
      else {
        pVVar12 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*
                            ((unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>
                              *)&local_98);
        pAVar5 = array->dictionary;
        uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert(pAVar5->length);
        ColumnArrowToDuckDB(pVVar12,pAVar5,array_state,uVar11,this_02,-1,(ValidityMask *)0x0,0,false
                           );
      }
    }
    local_d0._M_head_impl = (Vector *)local_98._0_8_;
    local_98._0_8_ = (_Head_base<0UL,_duckdb::Vector_*,_false>)0x0;
    ArrowArrayScanState::AddDictionary
              (array_state,
               (unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *)&local_d0,
               array->dictionary);
    if (local_d0._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_d0,local_d0._M_head_impl);
    }
    local_d0._M_head_impl = (Vector *)0x0;
    if ((Vector *)local_98._0_8_ != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_98,(Vector *)local_98._0_8_);
    }
  }
  ArrowType::GetDuckType(&local_98,this_00,false);
  pvVar6 = array->buffers[1];
  iVar13 = GetTypeIdSize(local_98.physical_type_);
  lVar14 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
  lVar14 = lVar14 + array->offset + local_80->chunk_offset;
  if (local_48 != -1) {
    lVar14 = array->offset + local_48;
  }
  indices_p = (data_ptr_t)((long)pvVar6 + lVar14 * iVar13);
  local_78.sel_vector = (sel_t *)0x0;
  local_78.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  local_78.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (add_null == false) {
    SetSelectionVector(&local_78,indices_p,&local_98,size,(ValidityMask *)0x0,0);
    this_03 = local_a0;
  }
  else {
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask = (unsigned_long *)0x0;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
    super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_c8.super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
    lVar14 = NumericCastImpl<long,_unsigned_long,_false>::Convert(parent_offset);
    GetValidityMask(&local_c8,array,(ArrowScanLocalState *)local_80->chunk_offset,size,lVar14,-1,
                    false);
    if ((parent_mask != (ValidityMask *)0x0) &&
       (size != 0 &&
        (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
        (unsigned_long *)0x0)) {
      uVar16 = 0;
      do {
        puVar7 = (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
        if (puVar7 != (unsigned_long *)0x0) {
          if ((puVar7[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) == 0) {
            if ((element_type *)local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
                (element_type *)0x0) {
              local_38 = local_c8.super_TemplatedValidityMask<unsigned_long>.capacity;
              make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                        ((duckdb *)&local_58,&local_38);
              p_Var2 = p_Stack_50;
              local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = (element_type *)local_58;
              this._M_pi = local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.
                           internal.
                           super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
              local_58 = (element_type *)0x0;
              p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
              super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi = p_Var2;
              if ((this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                 (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi),
                 p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
              }
              pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                  (&local_c8.super_TemplatedValidityMask<unsigned_long>.
                                    validity_data);
              local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask =
                   (pTVar15->owned_data).
                   super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                   super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                   super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            }
            local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar16 >> 6] =
                 local_c8.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar16 >> 6] &
                 ~(1L << ((byte)uVar16 & 0x3f));
          }
        }
        uVar16 = uVar16 + 1;
      } while (size != uVar16);
    }
    uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert(array->dictionary->length);
    SetSelectionVector(&local_78,indices_p,&local_98,size,&local_c8,uVar11);
    this_03 = local_a0;
    if (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_c8.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  other_00 = ArrowArrayScanState::GetDictionary(array_state);
  Vector::Slice(this_03,other_00,&local_78,size);
  Vector::Verify(this_03,size);
  if (local_78.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_78.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  LogicalType::~LogicalType(&local_98);
  return;
}

Assistant:

static void ColumnArrowToDuckDBDictionary(Vector &vector, ArrowArray &array, ArrowArrayScanState &array_state,
                                          idx_t size, const ArrowType &arrow_type, int64_t nested_offset,
                                          const ValidityMask *parent_mask, uint64_t parent_offset) {
	if (vector.GetBuffer()) {
		vector.GetBuffer()->SetAuxiliaryData(make_uniq<ArrowAuxiliaryData>(array_state.owned_data));
	}
	D_ASSERT(arrow_type.HasDictionary());
	auto &scan_state = array_state.state;
	const bool has_nulls = CanContainNull(array, parent_mask);
	if (array_state.CacheOutdated(array.dictionary)) {
		//! We need to set the dictionary data for this column
		auto base_vector = make_uniq<Vector>(vector.GetType(), NumericCast<idx_t>(array.dictionary->length));
		SetValidityMask(*base_vector, *array.dictionary, scan_state, NumericCast<idx_t>(array.dictionary->length), 0, 0,
		                has_nulls);
		auto &dictionary_type = arrow_type.GetDictionary();
		auto arrow_physical_type = GetArrowArrayPhysicalType(dictionary_type);
		switch (arrow_physical_type) {
		case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
			ColumnArrowToDuckDBDictionary(*base_vector, *array.dictionary, array_state,
			                              NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		case ArrowArrayPhysicalType::RUN_END_ENCODED:
			ColumnArrowToDuckDBRunEndEncoded(*base_vector, *array.dictionary, array_state,
			                                 NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		case ArrowArrayPhysicalType::DEFAULT:
			ColumnArrowToDuckDB(*base_vector, *array.dictionary, array_state,
			                    NumericCast<idx_t>(array.dictionary->length), dictionary_type);
			break;
		default:
			throw NotImplementedException("ArrowArrayPhysicalType not recognized");
		};
		array_state.AddDictionary(std::move(base_vector), array.dictionary);
	}
	auto offset_type = arrow_type.GetDuckType();
	//! Get Pointer to Indices of Dictionary
	auto indices = ArrowBufferData<data_t>(array, 1) +
	               GetTypeIdSize(offset_type.InternalType()) *
	                   GetEffectiveOffset(array, NumericCast<int64_t>(parent_offset), scan_state, nested_offset);

	SelectionVector sel;
	if (has_nulls) {
		ValidityMask indices_validity;
		GetValidityMask(indices_validity, array, scan_state, size, NumericCast<int64_t>(parent_offset));
		if (parent_mask && !parent_mask->AllValid()) {
			auto &struct_validity_mask = *parent_mask;
			for (idx_t i = 0; i < size; i++) {
				if (!struct_validity_mask.RowIsValid(i)) {
					indices_validity.SetInvalid(i);
				}
			}
		}
		SetSelectionVector(sel, indices, offset_type, size, &indices_validity,
		                   NumericCast<idx_t>(array.dictionary->length));
	} else {
		SetSelectionVector(sel, indices, offset_type, size);
	}
	vector.Slice(array_state.GetDictionary(), sel, size);
	vector.Verify(size);
}